

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O0

void setup_ext_line_bufs(H265eV511HalContext *ctx)

{
  int local_14;
  RK_S32 i;
  H265eV511HalContext *ctx_local;
  
  for (local_14 = 0; local_14 < ctx->task_cnt; local_14 = local_14 + 1) {
    if (ctx->ext_line_bufs[local_14] == (MppBuffer)0x0) {
      mpp_buffer_get_with_tag
                (ctx->ext_line_buf_grp,ctx->ext_line_bufs + local_14,(long)ctx->ext_line_buf_size,
                 "hal_h265e_v511","setup_ext_line_bufs");
    }
  }
  return;
}

Assistant:

static void setup_ext_line_bufs(H265eV510HalContext *ctx)
{
    RK_S32 i;

    for (i = 0; i < ctx->task_cnt; i++) {
        if (ctx->ext_line_bufs[i])
            continue;

        mpp_buffer_get(ctx->ext_line_buf_grp, &ctx->ext_line_bufs[i],
                       ctx->ext_line_buf_size);
    }
}